

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitLoop
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Loop *curr)

{
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,curr->body);
  emitScopeEnd(this,(Expression *)curr);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id == 1) {
    emitUnreachable(this);
    return;
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitLoop(Loop* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // we emitted a loop without a return type, so it must not be consumed
    emitUnreachable();
  }
}